

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O1

string * getAttribute(string *__return_storage_ptr__,string *source,string *attrName)

{
  pointer pcVar1;
  long lVar2;
  string attr_namefull;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  pcVar1 = (attrName->_M_dataplus)._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + attrName->_M_string_length);
  std::__cxx11::string::append((char *)&local_40);
  lVar2 = std::__cxx11::string::find((char *)source,(ulong)local_40,0);
  std::__cxx11::string::find((char *)source,0x448159,lVar2 + local_38);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)source);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getAttribute(const std::string &source, const std::string &attrName) {
	std::string attr_namefull = attrName + "=\"";
	std::size_t startpos = source.find(attr_namefull) + attr_namefull.size();
	std::size_t endpos = source.find("\"", startpos);
	return source.substr(startpos, endpos - startpos);
}